

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXCancellationRequest.cpp
# Opt level: O0

CancellationRequest *
ix::makeCancellationRequestWithTimeout
          (CancellationRequest *__return_storage_ptr__,int secs,
          atomic<bool> *requestInitCancellation)

{
  atomic<bool> *paVar1;
  undefined1 local_48 [8];
  anon_class_24_3_f0671c78 isCancellationRequested;
  seconds timeout;
  time_point start;
  atomic<bool> *requestInitCancellation_local;
  CancellationRequest *pCStack_10;
  int secs_local;
  
  requestInitCancellation_local._4_4_ = secs;
  pCStack_10 = __return_storage_ptr__;
  paVar1 = (atomic<bool> *)::std::chrono::_V2::system_clock::now();
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&isCancellationRequested.timeout,
             (int *)((long)&requestInitCancellation_local + 4));
  isCancellationRequested.start.__d.__r = (duration)(duration)isCancellationRequested.timeout.__r;
  local_48 = (undefined1  [8])requestInitCancellation;
  isCancellationRequested.requestInitCancellation = paVar1;
  ::std::function<bool()>::
  function<ix::makeCancellationRequestWithTimeout(int,std::atomic<bool>&)::__0,void>
            ((function<bool()> *)__return_storage_ptr__,(anon_class_24_3_f0671c78 *)local_48);
  return __return_storage_ptr__;
}

Assistant:

CancellationRequest makeCancellationRequestWithTimeout(int secs,
                                                           std::atomic<bool>& requestInitCancellation)
    {
        auto start = std::chrono::system_clock::now();
        auto timeout = std::chrono::seconds(secs);

        auto isCancellationRequested = [&requestInitCancellation, start, timeout]() -> bool
        {
            // Was an explicit cancellation requested ?
            if (requestInitCancellation) return true;

            auto now = std::chrono::system_clock::now();
            if ((now - start) > timeout) return true;

            // No cancellation request
            return false;
        };

        return isCancellationRequested;
    }